

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

void __thiscall
libDAI::HAK::findLoopClusters
          (HAK *this,FactorGraph *fg,
          set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *allcl,
          VarSet *newcl,Var *root,size_t length,VarSet *vars)

{
  bool bVar1;
  reference pVVar2;
  size_type sVar3;
  set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *in_RCX;
  FactorGraph *in_RDX;
  HAK *in_RSI;
  VarSet *in_R8;
  Var *in_R9;
  pair<std::_Rb_tree_const_iterator<libDAI::VarSet>,_bool> pVar4;
  VarSet *unaff_retaddr;
  VarSet ind;
  const_iterator in;
  VarSet *in_stack_fffffffffffffe38;
  VarSet *in_stack_fffffffffffffe40;
  Var *in_stack_fffffffffffffe48;
  HAK *in_stack_fffffffffffffe50;
  HAK *this_00;
  FactorGraph *in_stack_fffffffffffffe58;
  FactorGraph *pFVar5;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  bool local_181;
  VarSet local_150;
  VarSet *in_stack_fffffffffffffed0;
  VarSet *in_stack_fffffffffffffed8;
  undefined1 local_68 [32];
  Var *local_48;
  Var *local_40;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffffc8;
  
  local_40 = (Var *)VarSet::begin(in_stack_fffffffffffffe38);
  __gnu_cxx::
  __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
  __normal_iterator<libDAI::Var*>
            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_fffffffffffffe40,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              *)in_stack_fffffffffffffe38);
  while( true ) {
    local_48 = (Var *)VarSet::end(in_stack_fffffffffffffe38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    this_00 = in_RSI;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)&stack0xffffffffffffffc8);
    (*(code *)(((_Vector_impl *)
               &(in_RSI->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm)->
              super__Vector_impl_data)._M_start[7]._label)(local_68,in_RSI,pVVar2);
    sVar3 = VarSet::size((VarSet *)0xb47c60);
    local_181 = false;
    pFVar5 = in_RDX;
    if (1 < sVar3) {
      VarSet::VarSet((VarSet *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_181 = VarSet::operator>>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      VarSet::~VarSet((VarSet *)0xb47cdd);
      pFVar5 = in_RDX;
    }
    if (local_181 == false) {
      in_RDX = pFVar5;
      in_RSI = this_00;
      if ((Var *)0x1 < in_R9) {
        __gnu_cxx::
        __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
        ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                     *)&stack0xffffffffffffffc8);
        VarSet::VarSet((VarSet *)this_00,in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe40 = in_R8;
        VarSet::operator|(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        in_stack_fffffffffffffe48 = (Var *)((long)&in_R9[-1]._states + 7);
        in_R8 = in_stack_fffffffffffffe40;
        VarSet::operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        in_stack_fffffffffffffe38 = &local_150;
        findLoopClusters(in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                         (size_t)in_stack_ffffffffffffffc8._M_current,unaff_retaddr);
        VarSet::~VarSet((VarSet *)0xb47ef1);
        VarSet::~VarSet((VarSet *)0xb47efe);
        VarSet::~VarSet((VarSet *)0xb47f0b);
        in_stack_fffffffffffffe50 = this_00;
        in_stack_fffffffffffffe58 = pFVar5;
      }
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
      ::operator*((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                   *)&stack0xffffffffffffffc8);
      VarSet::VarSet((VarSet *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      VarSet::operator|(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      pVar4 = std::set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>::
              insert((set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
                      *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                     (value_type *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe67 = pVar4.second;
      VarSet::~VarSet((VarSet *)0xb47d74);
      VarSet::~VarSet((VarSet *)0xb47d81);
      in_RDX = pFVar5;
      in_RSI = this_00;
    }
    VarSet::~VarSet((VarSet *)0xb47f82);
    __gnu_cxx::
    __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
    ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  *)in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  }
  return;
}

Assistant:

void HAK::findLoopClusters( const FactorGraph & fg, std::set<VarSet> &allcl, VarSet newcl, const Var & root, size_t length, VarSet vars ) {
        for( VarSet::const_iterator in = vars.begin(); in != vars.end(); in++ ) {
            VarSet ind = fg.delta( *in );
            if( (newcl.size()) >= 2 && (ind >> root) ) {
                allcl.insert( newcl | *in );
            }
            else if( length > 1 )
                findLoopClusters( fg, allcl, newcl | *in, root, length - 1, ind / newcl );
        }
    }